

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

Identifier * __thiscall
SymbolTable::getUniqueLabelName(Identifier *__return_storage_ptr__,SymbolTable *this,bool local)

{
  undefined7 in_register_00000011;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_a0._M_dataplus._M_p = (pointer)this->uniqueCount;
  this->uniqueCount = (size_t)(local_a0._M_dataplus._M_p + 1);
  tinyformat::format<unsigned_long>(&local_80,"__armips_label_%08x__",(unsigned_long *)&local_a0);
  if ((int)CONCAT71(in_register_00000011,local) != 0) {
    std::operator+(&local_a0,"@@",&local_80);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&local_80);
  Identifier::Identifier((Identifier *)&local_a0,&local_40);
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::_M_insert_unique<Identifier>(&(this->generatedLabels)._M_t,(Identifier *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,(string *)&local_80);
  Identifier::Identifier(__return_storage_ptr__,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

Identifier SymbolTable::getUniqueLabelName(bool local)
{
	std::string name = tfm::format("__armips_label_%08x__",uniqueCount++);
	if (local)
		name = "@@" + name;

	generatedLabels.insert(Identifier(name));
	return Identifier(name);
}